

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

string * __thiscall
args::EitherFlag::str_abi_cxx11_(string *__return_storage_ptr__,EitherFlag *this)

{
  char cVar1;
  allocator local_19;
  EitherFlag *local_18;
  EitherFlag *this_local;
  
  local_18 = this;
  this_local = (EitherFlag *)__return_storage_ptr__;
  if ((this->isShort & 1U) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->longFlag);
  }
  else {
    cVar1 = this->shortFlag;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,1,cVar1,&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string str() const
        {
            return isShort ? std::string(1, shortFlag) : longFlag;
        }